

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int getNetherBiome(NetherNoise *nn,int x,int y,int z,float *ndel)

{
  float *in_R8;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float dsq;
  float dy;
  float dx;
  float dmin2;
  float dmin;
  int id;
  int i;
  float humidity;
  float temp;
  float npoints [5] [4];
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  float fVar6;
  undefined4 in_stack_ffffffffffffff74;
  float fVar7;
  undefined4 in_stack_ffffffffffffff78;
  int iVar8;
  int iVar9;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar10;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float local_78 [22];
  float *local_20;
  undefined4 local_10;
  
  local_20 = in_R8;
  memcpy(local_78,&DAT_00140c30,0x50);
  local_10 = 0;
  dVar5 = sampleDoublePerlin((DoublePerlinNoise *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  fVar1 = (float)dVar5;
  dVar5 = sampleDoublePerlin((DoublePerlinNoise *)CONCAT44(fVar1,in_stack_ffffffffffffff80),
                             (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  fVar3 = 3.4028235e+38;
  fVar4 = 3.4028235e+38;
  iVar9 = 0;
  for (iVar10 = 0; iVar10 < 5; iVar10 = iVar10 + 1) {
    fVar2 = (local_78[(long)iVar10 * 4] - fVar1) * (local_78[(long)iVar10 * 4] - fVar1) +
            (local_78[(long)iVar10 * 4 + 1] - (float)dVar5) *
            (local_78[(long)iVar10 * 4 + 1] - (float)dVar5) + local_78[(long)iVar10 * 4 + 2];
    fVar6 = fVar4;
    fVar7 = fVar2;
    iVar8 = iVar10;
    if ((fVar4 <= fVar2) && (fVar6 = fVar3, fVar7 = fVar4, iVar8 = iVar9, fVar2 < fVar3)) {
      fVar6 = fVar2;
    }
    fVar3 = fVar6;
    fVar4 = fVar7;
    iVar9 = iVar8;
  }
  if (local_20 != (float *)0x0) {
    fVar3 = sqrtf(fVar3);
    fVar4 = sqrtf(fVar4);
    *local_20 = fVar3 - fVar4;
  }
  return (int)local_78[(long)iVar9 * 4 + 3];
}

Assistant:

int getNetherBiome(const NetherNoise *nn, int x, int y, int z, float *ndel)
{
    const float npoints[5][4] = {
        { 0,    0,      0,              nether_wastes       },
        { 0,   -0.5,    0,              soul_sand_valley    },
        { 0.4,  0,      0,              crimson_forest      },
        { 0,    0.5,    0.375*0.375,    warped_forest       },
        {-0.5,  0,      0.175*0.175,    basalt_deltas       },
    };

    y = 0;
    float temp = sampleDoublePerlin(&nn->temperature, x, y, z);
    float humidity = sampleDoublePerlin(&nn->humidity, x, y, z);

    int i, id = 0;
    float dmin = FLT_MAX;
    float dmin2 = FLT_MAX;
    for (i = 0; i < 5; i++)
    {
        float dx = npoints[i][0] - temp;
        float dy = npoints[i][1] - humidity;
        float dsq = dx*dx + dy*dy + npoints[i][2];
        if (dsq < dmin)
        {
            dmin2 = dmin;
            dmin = dsq;
            id = i;
        }
        else if (dsq < dmin2)
            dmin2 = dsq;
    }

    if (ndel)
        *ndel = sqrtf(dmin2) - sqrtf(dmin);

    id = (int) npoints[id][3];
    return id;
}